

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O1

void __thiscall
testing::internal::
TypedExpectation<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
::~TypedExpectation(TypedExpectation<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
                    *this)

{
  void *pvVar1;
  _Manager_type p_Var2;
  pointer ppvVar3;
  
  (this->super_ExpectationBase)._vptr_ExpectationBase =
       (_func_int **)&PTR__TypedExpectation_00197b18;
  ExpectationBase::CheckActionCountIfNotDone(&this->super_ExpectationBase);
  for (ppvVar3 = (this->super_ExpectationBase).untyped_actions_.
                 super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppvVar3 !=
      (this->super_ExpectationBase).untyped_actions_.
      super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppvVar3 = ppvVar3 + 1) {
    pvVar1 = *ppvVar3;
    if (pvVar1 != (void *)0x0) {
      if (*(code **)((long)pvVar1 + 0x10) != (code *)0x0) {
        (**(code **)((long)pvVar1 + 0x10))(pvVar1,pvVar1,3);
      }
      operator_delete(pvVar1,0x20);
    }
  }
  p_Var2 = (this->repeated_action_).fun_.super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->repeated_action_,(_Any_data *)&this->repeated_action_,
              __destroy_functor);
  }
  MatcherBase<const_std::tuple<const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&>_&>
  ::~MatcherBase(&(this->extra_matcher_).
                  super_MatcherBase<const_std::tuple<const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&>_&>
                );
  MatcherBase<const_pstore::brokerface::fifo_path_&>::~MatcherBase
            ((MatcherBase<const_pstore::brokerface::fifo_path_&> *)
             &(this->matchers_).
              super__Tuple_impl<0UL,_testing::Matcher<const_pstore::brokerface::fifo_path_&>,_testing::Matcher<const_pstore::broker::broker_command_&>_>
              .super__Head_base<0UL,_testing::Matcher<const_pstore::brokerface::fifo_path_&>,_false>
            );
  MatcherBase<const_pstore::broker::broker_command_&>::~MatcherBase
            ((MatcherBase<const_pstore::broker::broker_command_&> *)&this->matchers_);
  ExpectationBase::~ExpectationBase(&this->super_ExpectationBase);
  return;
}

Assistant:

~TypedExpectation() override {
    // Check the validity of the action count if it hasn't been done
    // yet (for example, if the expectation was never used).
    CheckActionCountIfNotDone();
    for (UntypedActions::const_iterator it = untyped_actions_.begin();
         it != untyped_actions_.end(); ++it) {
      delete static_cast<const Action<F>*>(*it);
    }
  }